

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkMessage(google::protobuf::Descriptor*,google::protobuf::DescriptorProto_const&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  int iVar1;
  ushort *puVar2;
  long *plVar3;
  undefined8 extraout_RAX;
  size_t in_R9;
  long *unaff_R15;
  string_view format;
  ulong local_38;
  long local_30;
  ulong local_28;
  long local_20;
  
  iVar1 = **(int **)(this + 8);
  if (iVar1 < 1) {
    InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkMessage(google::protobuf::Descriptor*,google::protobuf::DescriptorProto_const&)::__0,std::__cxx11::string>
              ();
  }
  else if (iVar1 <= *(int *)(**(long **)this + 8)) {
    puVar2 = *(ushort **)(*(long *)(**(long **)this + 0x40) + 8 + (ulong)(iVar1 - 1) * 0x58);
    local_38 = (ulong)*puVar2;
    local_28 = (ulong)**(ushort **)(**(long **)(this + 0x10) + 8);
    local_30 = ~local_38 + (long)puVar2;
    local_20 = ~local_28 + (long)*(ushort **)(**(long **)(this + 0x10) + 8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    format._M_str = (char *)&local_38;
    format._M_len =
         (size_t)
         "Fields in the same oneof must be defined consecutively. \"$0\" cannot be defined before the completion of the \"$1\" oneof definition."
    ;
    substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x82,format,
               (Nullable<const_absl::string_view_*>)0x2,in_R9);
    return __return_storage_ptr__;
  }
  InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkMessage(google::protobuf::Descriptor*,google::protobuf::DescriptorProto_const&)::__0,std::__cxx11::string>
            ();
  plVar3 = (long *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if (plVar3 != unaff_R15) {
    operator_delete(plVar3,*unaff_R15 + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}